

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyfile.c
# Opt level: O0

econf_err getFloatValueNum(econf_file key_file,size_t num,float *result)

{
  int *piVar1;
  float fVar2;
  char *local_28;
  char *endptr;
  float *result_local;
  size_t num_local;
  
  endptr = (char *)result;
  result_local = (float *)num;
  piVar1 = __errno_location();
  *piVar1 = 0;
  fVar2 = strtof(key_file.file_entry[(long)result_local].value,&local_28);
  *(float *)endptr = fVar2;
  if (local_28 == key_file.file_entry[(long)result_local].value) {
    num_local._4_4_ = ECONF_VALUE_CONVERSION_ERROR;
  }
  else {
    num_local._4_4_ = ECONF_SUCCESS;
  }
  return num_local._4_4_;
}

Assistant:

econf_err getFloatValueNum(econf_file key_file, size_t num, float *result) {
  char *endptr;
  errno = 0;
  *result = strtof(key_file.file_entry[num].value, &endptr);
  if (endptr == key_file.file_entry[num].value) /* do not check errno because it is a false alarm in ppc and S390 */
    return ECONF_VALUE_CONVERSION_ERROR;
  return ECONF_SUCCESS;
}